

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGenInitializer.cxx
# Opt level: O2

void __thiscall
cmQtAutoGenInitializer::AddGeneratedSource
          (cmQtAutoGenInitializer *this,ConfigString *filename,GenVarsT *genVars,bool prepend)

{
  pointer pbVar1;
  cmGeneratorTarget *this_00;
  int iVar2;
  cmSourceFile *pcVar3;
  mapped_type *filename_00;
  pointer __k;
  static_string_view local_d0;
  static_string_view local_c0;
  cmAlphaNum local_b0;
  cmAlphaNum local_80;
  string local_50;
  
  if (this->MultiConfig == true) {
    iVar2 = (*this->GlobalGen->_vptr_cmGlobalGenerator[0x27])();
    if ((char)iVar2 == '\0') {
      pbVar1 = (this->ConfigsList).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (__k = (this->ConfigsList).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; __k != pbVar1; __k = __k + 1) {
        filename_00 = std::__detail::
                      _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                      ::at((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                            *)&filename->Config,__k);
        pcVar3 = RegisterGeneratedSource(this,filename_00);
        handleSkipPch(this,pcVar3);
        this_00 = this->GenTarget;
        local_80.View_._M_len = 0xb;
        local_80.View_._M_str = "$<$<CONFIG:";
        local_b0.View_._M_str = (__k->_M_dataplus)._M_p;
        local_b0.View_._M_len = __k->_M_string_length;
        local_c0.super_string_view._M_len = 2;
        local_c0.super_string_view._M_str = ">:";
        local_d0.super_string_view._M_len = 1;
        local_d0.super_string_view._M_str = ">";
        cmStrCat<cm::static_string_view,std::__cxx11::string,cm::static_string_view>
                  (&local_50,&local_80,&local_b0,&local_c0,filename_00,&local_d0);
        cmGeneratorTarget::AddSource(this_00,&local_50,prepend);
        std::__cxx11::string::~string((string *)&local_50);
        AddToSourceGroup(this,filename_00,genVars->GenNameUpper);
      }
      return;
    }
  }
  pcVar3 = AddGeneratedSource(this,&filename->Default,genVars,prepend);
  handleSkipPch(this,pcVar3);
  return;
}

Assistant:

void cmQtAutoGenInitializer::AddGeneratedSource(ConfigString const& filename,
                                                GenVarsT const& genVars,
                                                bool prepend)
{
  // XXX(xcode-per-cfg-src): Drop the Xcode-specific part of the condition
  // when the Xcode generator supports per-config sources.
  if (!this->MultiConfig || this->GlobalGen->IsXcode()) {
    cmSourceFile* sf =
      this->AddGeneratedSource(filename.Default, genVars, prepend);
    handleSkipPch(sf);
    return;
  }
  for (auto const& cfg : this->ConfigsList) {
    std::string const& filenameCfg = filename.Config.at(cfg);
    // Register source at makefile
    cmSourceFile* sf = this->RegisterGeneratedSource(filenameCfg);
    handleSkipPch(sf);
    // Add source file to target for this configuration.
    this->GenTarget->AddSource(
      cmStrCat("$<$<CONFIG:"_s, cfg, ">:"_s, filenameCfg, ">"_s), prepend);
    // Add source file to source group
    this->AddToSourceGroup(filenameCfg, genVars.GenNameUpper);
  }
}